

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  int iVar9;
  xmlParserErrors error;
  int iVar10;
  int iVar11;
  int l;
  int local_3c;
  xmlParserInputState local_38;
  uint local_34;
  
  local_38 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar2 = ctxt->input;
    if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
       ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar4 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar6 = (xmlChar *)0x0;
      error = XML_ERR_LITERAL_NOT_STARTED;
LAB_0015e434:
      xmlFatalErr(ctxt,error,(char *)0x0);
      return pxVar6;
    }
    uVar4 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
  local_34 = uVar4;
  uVar4 = xmlCurrentChar(ctxt,&local_3c);
  iVar9 = 100;
  iVar11 = 0;
  iVar10 = 0;
  do {
    if ((int)uVar4 < 0x100) {
      if ((((int)uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)))) ||
         (uVar4 == local_34)) goto LAB_0015e452;
    }
    else if ((uVar4 == local_34) ||
            ((uVar4 - 0xfffe < 0xffffe002 && uVar4 - 0x110000 < 0xfff00000) && 0xd7ff < (int)uVar4))
    {
LAB_0015e452:
      pxVar6[iVar11] = '\0';
      ctxt->instate = local_38;
      if ((int)uVar4 < 0x100) {
        if ((0x1f < (int)uVar4) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
LAB_0015e484:
          xmlNextChar(ctxt);
          return pxVar6;
        }
      }
      else if ((uVar4 - 0x10000 < 0x100000 || uVar4 - 0xe000 < 0x1ffe) || (int)uVar4 < 0xd800)
      goto LAB_0015e484;
      error = XML_ERR_LITERAL_NOT_FINISHED;
      goto LAB_0015e434;
    }
    pxVar7 = pxVar6;
    if (iVar9 <= iVar11 + 5) {
      if ((iVar9 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
        iVar9 = iVar9 * 2;
        pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(long)iVar9);
        if (pxVar7 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar6);
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_0015e2fa;
        }
        bVar3 = true;
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(pxVar6);
LAB_0015e2fa:
        ctxt->instate = local_38;
        bVar3 = false;
        pxVar7 = pxVar6;
      }
      if (!bVar3) {
        return (xmlChar *)0x0;
      }
    }
    if (iVar10 < 0x32) {
      iVar10 = iVar10 + 1;
    }
    else {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar10 = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        (*xmlFree)(pxVar7);
        return (xmlChar *)0x0;
      }
    }
    if (local_3c == 1) {
      lVar8 = (long)iVar11;
      iVar11 = iVar11 + 1;
      pxVar7[lVar8] = (xmlChar)uVar4;
    }
    else {
      iVar5 = xmlCopyCharMultiByte(pxVar7 + iVar11,uVar4);
      iVar11 = iVar5 + iVar11;
    }
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar2->cur = pxVar2->cur + local_3c;
    uVar4 = xmlCurrentChar(ctxt,&local_3c);
    pxVar6 = pxVar7;
    if (uVar4 == 0) {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->progressive == 0) {
        pxVar2 = ctxt->input;
        if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
           ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
          xmlSHRINK(ctxt);
        }
      }
      uVar4 = xmlCurrentChar(ctxt,&local_3c);
    }
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
		ctxt->instate = (xmlParserInputState) state;
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}